

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  pointer pcVar1;
  cmFindLibraryCommand *pcVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string libX;
  string msg;
  string lib;
  string local_120;
  cmFindLibraryCommand *local_100;
  string local_f8;
  string local_d8;
  pointer local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_100 = this;
  lVar5 = std::__cxx11::string::find((char *)dir,0x8e76dd,start_pos);
  if (lVar5 != -1) {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)dir);
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_d8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_d8._M_dataplus._M_p,
               (char *)(local_d8._M_string_length + (long)local_d8._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_120);
    bVar4 = cmsys::SystemTools::FileIsDirectory(&local_120);
    if (bVar3 && bVar4) {
      bVar4 = cmLibDirsLinked(&local_120,&local_d8);
      if (!bVar4) {
LAB_003d550a:
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)dir);
        std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        sVar6 = strlen(suffix);
        AddArchitecturePath(local_100,&local_120,lVar5 + sVar6 + 4,suffix,true);
      }
    }
    else if (bVar4) goto LAB_003d550a;
    if (bVar3) {
      AddArchitecturePath(local_100,dir,lVar5 + 4,suffix,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (!fresh) {
    return;
  }
  bVar3 = cmsys::SystemTools::FileIsDirectory(dir);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  pcVar1 = (dir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar1,pcVar1 + dir->_M_string_length);
  std::__cxx11::string::append((char *)&local_120);
  bVar4 = cmsys::SystemTools::FileIsDirectory(&local_120);
  if (bVar3 && bVar4) {
    bVar4 = cmLibDirsLinked(&local_120,dir);
    if (bVar4) goto LAB_003d576f;
  }
  else if (!bVar4) goto LAB_003d576f;
  std::__cxx11::string::append((char *)&local_120);
  pcVar2 = local_100;
  if ((local_100->super_cmFindBase).super_cmFindCommon.DebugMode == true) {
    local_d8._M_dataplus._M_p = (pointer)0xd;
    local_d8._M_string_length = 0x8b4f73;
    local_d8.field_2._M_allocated_capacity = 0;
    local_b8 = (local_100->super_cmFindBase).VariableName._M_dataplus._M_p;
    local_d8.field_2._8_8_ = (local_100->super_cmFindBase).VariableName._M_string_length;
    local_b0 = 0;
    local_a8 = 0x19;
    local_a0 = ") added replacement path ";
    local_98 = 0;
    local_90 = local_120._M_string_length;
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_120._M_dataplus._M_p;
    local_80 = 0;
    local_78 = 0x2b;
    local_70 = " to PATH_SUFFIXES for architecture suffix \'";
    local_68 = 0;
    local_60 = strlen(suffix);
    local_50 = 0;
    local_48 = 1;
    local_40 = "\'";
    local_38 = 0;
    views._M_len = 7;
    views._M_array = (iterator)&local_d8;
    local_58 = suffix;
    cmCatViews(&local_f8,views);
    cmFindCommon::DebugMessage(&(pcVar2->super_cmFindBase).super_cmFindCommon,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(local_100->super_cmFindBase).super_cmFindCommon.SearchPaths,&local_120);
LAB_003d576f:
  if ((bVar3) &&
     (std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(local_100->super_cmFindBase).super_cmFindCommon.SearchPaths,dir),
     pcVar2 = local_100, (local_100->super_cmFindBase).super_cmFindCommon.DebugMode == true)) {
    local_d8._M_dataplus._M_p = (pointer)0xd;
    local_d8._M_string_length = 0x8b4f73;
    local_d8.field_2._M_allocated_capacity = 0;
    local_b8 = (local_100->super_cmFindBase).VariableName._M_dataplus._M_p;
    local_d8.field_2._8_8_ = (local_100->super_cmFindBase).VariableName._M_string_length;
    local_b0 = 0;
    local_a8 = 0x19;
    local_a0 = ") added replacement path ";
    local_98 = 0;
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(dir->_M_dataplus)._M_p;
    local_90 = dir->_M_string_length;
    local_80 = 0;
    local_78 = 0x2b;
    local_70 = " to PATH_SUFFIXES for architecture suffix \'";
    local_68 = 0;
    local_60 = strlen(suffix);
    local_50 = 0;
    local_48 = 1;
    local_40 = "\'";
    local_38 = 0;
    views_00._M_len = 7;
    views_00._M_array = (iterator)&local_d8;
    local_58 = suffix;
    cmCatViews(&local_f8,views_00);
    cmFindCommon::DebugMessage(&(pcVar2->super_cmFindBase).super_cmFindCommon,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos, const char* suffix,
  bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);

  if (pos != std::string::npos) {
    // Check for "lib".
    std::string lib = dir.substr(0, pos + 3);
    bool use_lib = cmSystemTools::FileIsDirectory(lib);

    // Check for "lib<suffix>" and use it first.
    std::string libX = lib + suffix;
    bool use_libX = cmSystemTools::FileIsDirectory(libX);

    // Avoid copies of the same directory due to symlinks.
    if (use_libX && use_lib && cmLibDirsLinked(libX, lib)) {
      use_libX = false;
    }

    if (use_libX) {
      libX += dir.substr(pos + 3);
      std::string::size_type libX_pos = pos + 3 + strlen(suffix) + 1;
      this->AddArchitecturePath(libX, libX_pos, suffix);
    }

    if (use_lib) {
      this->AddArchitecturePath(dir, pos + 3 + 1, suffix, false);
    }
  }

  if (fresh) {
    // Check for the original unchanged path.
    bool use_dir = cmSystemTools::FileIsDirectory(dir);

    // Check for <dir><suffix>/ and use it first.
    std::string dirX = dir + suffix;
    bool use_dirX = cmSystemTools::FileIsDirectory(dirX);

    // Avoid copies of the same directory due to symlinks.
    if (use_dirX && use_dir && cmLibDirsLinked(dirX, dir)) {
      use_dirX = false;
    }

    if (use_dirX) {
      dirX += "/";
      if (this->DebugMode) {
        std::string msg = cmStrCat(
          "find_library(", this->VariableName, ") added replacement path ",
          dirX, " to PATH_SUFFIXES for architecture suffix '", suffix, "'");
        this->DebugMessage(msg);
      }
      this->SearchPaths.push_back(std::move(dirX));
    }

    if (use_dir) {
      this->SearchPaths.push_back(dir);
      if (this->DebugMode) {
        std::string msg = cmStrCat(
          "find_library(", this->VariableName, ") added replacement path ",
          dir, " to PATH_SUFFIXES for architecture suffix '", suffix, "'");
        this->DebugMessage(msg);
      }
    }
  }
}